

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkNodeDup(Abc_Ntk_t *pNtkInit,int nLimit,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar4;
  int local_58;
  int local_54;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *vFanouts;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  int nLimit_local;
  Abc_Ntk_t *pNtkInit_local;
  
  pNtk_00 = Abc_NtkDup(pNtkInit);
  p = Vec_PtrAlloc(100);
  vNodes_00 = Vec_PtrAlloc(100);
  do {
    Vec_PtrClear(p);
    for (local_54 = 0; iVar1 = Vec_PtrSize(pNtk_00->vObjs), local_54 < iVar1;
        local_54 = local_54 + 1) {
      pAVar3 = Abc_NtkObj(pNtk_00,local_54);
      if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) &&
         (iVar1 = Abc_ObjFanoutNum(pAVar3), nLimit <= iVar1)) {
        Vec_PtrPush(p,pAVar3);
      }
    }
    for (local_54 = 0; iVar1 = Vec_PtrSize(p), local_54 < iVar1; local_54 = local_54 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,local_54);
      pObj_00 = Abc_NtkDupObj(pNtk_00,pAVar3,0);
      for (local_58 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_58 < iVar1; local_58 = local_58 + 1)
      {
        pAVar4 = Abc_ObjFanin(pAVar3,local_58);
        Abc_ObjAddFanin(pObj_00,pAVar4);
      }
      Abc_NodeCollectFanouts(pAVar3,vNodes_00);
      Vec_PtrShrink(vNodes_00,nLimit / 2);
      for (local_58 = 0; iVar1 = Vec_PtrSize(vNodes_00), local_58 < iVar1; local_58 = local_58 + 1)
      {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,local_58);
        Abc_ObjPatchFanin(pAVar4,pAVar3,pObj_00);
      }
    }
    if (fVerbose != 0) {
      uVar2 = Vec_PtrSize(p);
      printf("Duplicated %d nodes.\n",(ulong)uVar2);
    }
    iVar1 = Vec_PtrSize(p);
  } while (0 < iVar1);
  Vec_PtrFree(vNodes_00);
  Vec_PtrFree(p);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkNodeDup( Abc_Ntk_t * pNtkInit, int nLimit, int fVerbose )
{
    Vec_Ptr_t * vNodes, * vFanouts;
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pObj, * pObjNew, * pFanin, * pFanout;
    int i, k;
    pNtk = Abc_NtkDup( pNtkInit );
    vNodes = Vec_PtrAlloc( 100 );
    vFanouts = Vec_PtrAlloc( 100 );
    do
    {
        Vec_PtrClear( vNodes );
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( Abc_ObjFanoutNum(pObj) >= nLimit )
                Vec_PtrPush( vNodes, pObj );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        {
            pObjNew = Abc_NtkDupObj( pNtk, pObj, 0 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObjNew, pFanin );
            Abc_NodeCollectFanouts( pObj, vFanouts );
            Vec_PtrShrink( vFanouts, nLimit / 2 );
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
                Abc_ObjPatchFanin( pFanout, pObj, pObjNew );
        }
        if ( fVerbose )
            printf( "Duplicated %d nodes.\n", Vec_PtrSize(vNodes) );
    }
    while ( Vec_PtrSize(vNodes) > 0 );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    return pNtk;
}